

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-model-load-cancel.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  uint uVar1;
  char *__filename;
  FILE *__stream;
  long lVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  byte bVar5;
  undefined8 auStack_b8 [10];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  code *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined2 local_28;
  undefined4 local_26;
  undefined2 local_22;
  
  bVar5 = 0;
  __filename = get_model_or_exit(argc,argv);
  __stream = fopen(__filename,"r");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"no model at \'%s\' found\n",__filename);
    uVar1 = 1;
  }
  else {
    fprintf(_stderr,"using \'%s\'\n",__filename);
    fclose(__stream);
    llama_backend_init();
    local_58 = 0;
    uStack_50 = 0;
    local_68 = 0;
    uStack_60 = 0;
    local_48 = 0;
    local_38 = 0;
    uStack_30 = 0;
    local_28 = 0;
    local_22 = 0;
    local_26 = 0;
    local_40 = main::anon_class_1_0_00000001::__invoke;
    puVar3 = &local_68;
    puVar4 = auStack_b8;
    for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
      *puVar4 = *puVar3;
      puVar3 = puVar3 + (ulong)bVar5 * -2 + 1;
      puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
    }
    lVar2 = llama_model_load_from_file(__filename);
    llama_backend_free();
    uVar1 = (uint)(lVar2 != 0);
  }
  return uVar1;
}

Assistant:

int main(int argc, char *argv[] ) {
    auto * model_path = get_model_or_exit(argc, argv);
    auto * file = fopen(model_path, "r");
    if (file == nullptr) {
        fprintf(stderr, "no model at '%s' found\n", model_path);
        return EXIT_FAILURE;
    }

    fprintf(stderr, "using '%s'\n", model_path);
    fclose(file);

    llama_backend_init();
    auto params = llama_model_params{};
    params.use_mmap = false;
    params.progress_callback = [](float progress, void * ctx){
        (void) ctx;
        return progress > 0.50;
    };
    auto * model = llama_model_load_from_file(model_path, params);
    llama_backend_free();
    return model == nullptr ? EXIT_SUCCESS : EXIT_FAILURE;
}